

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

handle pybind11::detail::
       tuple_caster<std::pair,Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>>::
       cast_impl<std::pair<Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>>,0ul,1ul>
                 (double *src,size_t param_2)

{
  undefined8 uVar1;
  double dVar2;
  Matrix<double,_1,_3,_1,_1,_3> *pMVar3;
  handle hVar4;
  array<pybind11::object,_2UL> *__range3;
  long lVar5;
  array<pybind11::object,_2UL> entries;
  tuple result;
  handle local_28;
  PyObject *local_20;
  handle local_18;
  
  pMVar3 = (Matrix<double,_1,_3,_1,_1,_3> *)
           Eigen::PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>>::operator_new
                     ((PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>> *)0x18,param_2);
  dVar2 = src[1];
  (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array[0] =
       *src;
  (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array[1] =
       dVar2;
  (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array[2] =
       src[2];
  local_28 = eigen_encapsulate<pybind11::detail::EigenProps<Eigen::Matrix<double,1,3,1,1,3>>,Eigen::Matrix<double,1,3,1,1,3>,void>
                       (pMVar3);
  pMVar3 = (Matrix<double,_1,_3,_1,_1,_3> *)
           Eigen::PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>>::operator_new
                     ((PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>> *)0x18,param_2);
  (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array[2] =
       src[5];
  dVar2 = src[4];
  (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array[0] =
       src[3];
  (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array[1] =
       dVar2;
  local_20 = (PyObject *)
             eigen_encapsulate<pybind11::detail::EigenProps<Eigen::Matrix<double,1,3,1,1,3>>,Eigen::Matrix<double,1,3,1,1,3>,void>
                       (pMVar3);
  if (local_20 == (PyObject *)0x0 || local_28.m_ptr == (PyObject *)0x0) {
    hVar4.m_ptr = (PyObject *)0x0;
  }
  else {
    tuple::tuple((tuple *)&local_18,2);
    hVar4.m_ptr = local_18.m_ptr;
    lVar5 = 0;
    do {
      uVar1 = *(undefined8 *)((long)&local_28.m_ptr + lVar5);
      *(undefined8 *)((long)&local_28.m_ptr + lVar5) = 0;
      if (((local_18.m_ptr)->ob_type->tp_flags & 0x4000000) == 0) {
        __assert_fail("PyTuple_Check(result.ptr())",
                      "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/pybind11/include/pybind11/cast.h"
                      ,0x588,
                      "static handle pybind11::detail::tuple_caster<std::pair, Eigen::Matrix<double, 1, 3>, Eigen::Matrix<double, 1, 3>>::cast_impl(T &&, return_value_policy, handle, index_sequence<Is...>) [Tuple = std::pair, Ts = <Eigen::Matrix<double, 1, 3>, Eigen::Matrix<double, 1, 3>>, T = std::pair<Eigen::Matrix<double, 1, 3>, Eigen::Matrix<double, 1, 3>>, Is = <0UL, 1UL>]"
                     );
      }
      *(undefined8 *)((long)&local_18.m_ptr[1].ob_type + lVar5) = uVar1;
      lVar5 = lVar5 + 8;
    } while (lVar5 != 0x10);
    local_18.m_ptr = (PyObject *)0x0;
    object::~object((object *)&local_18);
  }
  lVar5 = 8;
  do {
    object::~object((object *)((long)&local_28.m_ptr + lVar5));
    lVar5 = lVar5 + -8;
  } while (lVar5 != -8);
  return (handle)hVar4.m_ptr;
}

Assistant:

static handle cast_impl(T &&src, return_value_policy policy, handle parent, index_sequence<Is...>) {
        std::array<object, size> entries{{
            reinterpret_steal<object>(make_caster<Ts>::cast(std::get<Is>(std::forward<T>(src)), policy, parent))...
        }};
        for (const auto &entry: entries)
            if (!entry)
                return handle();
        tuple result(size);
        int counter = 0;
        for (auto & entry: entries)
            PyTuple_SET_ITEM(result.ptr(), counter++, entry.release().ptr());
        return result.release();
    }